

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PathBezierCubicCurveTo
          (ImDrawList *this,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,int num_segments)

{
  ImVector<ImVec2> *this_00;
  ImVec2 *pIVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [64];
  ImVec2 local_40;
  ImVec2 p1;
  undefined1 extraout_var [56];
  
  this_00 = &this->_Path;
  pIVar1 = ImVector<ImVec2>::back(this_00);
  p1 = *pIVar1;
  if (num_segments == 0) {
    PathBezierCubicCurveToCasteljau
              (this_00,p1.x,p1.y,p2->x,p2->y,p3->x,p3->y,p4->x,p4->y,
               this->_Data->CurveTessellationTol,0);
  }
  else {
    iVar3 = 0;
    if (0 < num_segments) {
      iVar3 = num_segments;
    }
    for (iVar2 = 1; iVar2 - iVar3 != 1; iVar2 = iVar2 + 1) {
      auVar4._0_8_ = ImBezierCubicCalc(&p1,p2,p3,p4,(float)iVar2 * (1.0 / (float)num_segments));
      auVar4._8_56_ = extraout_var;
      local_40 = (ImVec2)vmovlps_avx(auVar4._0_16_);
      ImVector<ImVec2>::push_back(this_00,&local_40);
    }
  }
  return;
}

Assistant:

void ImDrawList::PathBezierCubicCurveTo(const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        PathBezierCubicCurveToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, _Data->CurveTessellationTol, 0); // Auto-tessellated
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
            _Path.push_back(ImBezierCubicCalc(p1, p2, p3, p4, t_step * i_step));
    }
}